

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O2

Result<wasm::Tag_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addTagDecl
          (Result<wasm::Tag_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames)

{
  int __val;
  Tag *pTVar1;
  _Variant_storage<false,wasm::Tag*,wasm::Err> *p_Var2;
  char *pcVar3;
  IString IVar4;
  string local_b0;
  string local_90;
  string_view local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Variant_storage<false,wasm::Tag*,wasm::Err> *local_40;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_38;
  __single_object t;
  
  local_40 = (_Variant_storage<false,wasm::Tag*,wasm::Err> *)__return_storage_ptr__;
  std::make_unique<wasm::Tag>();
  if (name.super_IString.str._M_str == (char *)0x0) {
    __val = this->tagCounter;
    this->tagCounter = __val + 1;
    std::__cxx11::to_string(&local_90,__val);
    pcVar3 = "eimport$";
    if (importNames == (ImportNames *)0x0) {
      pcVar3 = "tag$";
    }
    std::operator+(&local_60,pcVar3,&local_90);
    IString::IString((IString *)&local_70,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_90);
    IVar4.str = (string_view)Names::getValidTagName(this->wasm,local_70);
    *(string_view *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl = IVar4.str;
  }
  else {
    pTVar1 = Module::getTagOrNull(this->wasm,name);
    if (pTVar1 != (Tag *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"repeated tag name",(allocator<char> *)&local_90);
      Lexer::err((Err *)&local_60,&this->in,(ulong)pos,&local_b0);
      p_Var2 = local_40;
      std::__detail::__variant::_Variant_storage<false,wasm::Tag*,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>(local_40,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_00bff23a;
    }
    *(size_t *)
     local_38._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl = name.super_IString.str._M_len;
    *(char **)((long)local_38._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                     ._M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 8) =
         name.super_IString.str._M_str;
    *(bool *)((long)local_38._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                    _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                    super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x10) = true;
  }
  if (importNames != (ImportNames *)0x0) {
    pcVar3 = (importNames->mod).super_IString.str._M_str;
    (((Tag *)local_38._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
             super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl)->super_Importable).module.
    super_IString.str._M_len = (importNames->mod).super_IString.str._M_len;
    (((Tag *)local_38._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
             super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl)->super_Importable).module.
    super_IString.str._M_str = pcVar3;
    pcVar3 = (importNames->nm).super_IString.str._M_str;
    (((Tag *)local_38._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
             super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl)->super_Importable).base.
    super_IString.str._M_len = (importNames->nm).super_IString.str._M_len;
    (((Tag *)local_38._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
             super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl)->super_Importable).base.
    super_IString.str._M_str = pcVar3;
  }
  pTVar1 = Module::addTag(this->wasm,&local_38);
  *(Tag **)local_40 = pTVar1;
  local_40[0x20] = (_Variant_storage<false,wasm::Tag*,wasm::Err>)0x0;
  p_Var2 = local_40;
LAB_00bff23a:
  std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&local_38);
  return (Result<wasm::Tag_*> *)p_Var2;
}

Assistant:

Result<Tag*>
ParseDeclsCtx::addTagDecl(Index pos, Name name, ImportNames* importNames) {
  auto t = std::make_unique<Tag>();
  if (name) {
    if (wasm.getTagOrNull(name)) {
      // TODO: if the existing tag is not explicitly named, fix its name and
      // continue.
      return in.err(pos, "repeated tag name");
    }
    t->setExplicitName(name);
  } else {
    name = (importNames ? "eimport$" : "tag$") + std::to_string(tagCounter++);
    name = Names::getValidTagName(wasm, name);
    t->name = name;
  }
  applyImportNames(*t, importNames);
  return wasm.addTag(std::move(t));
}